

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5VocabBestIndexMethod(sqlite3_vtab *pUnused,sqlite3_index_info *pInfo)

{
  char cVar1;
  sqlite3_index_constraint *psVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  
  uVar9 = 0;
  uVar7 = (ulong)(uint)pInfo->nConstraint;
  if (pInfo->nConstraint < 1) {
    uVar7 = uVar9;
  }
  uVar5 = 0xffffffffffffffff;
  lVar10 = 5;
  uVar8 = 0xffffffff;
  uVar3 = 0xffffffff;
  for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    psVar2 = pInfo->aConstraint;
    if ((*(char *)((long)&psVar2->iColumn + lVar10) != '\0') &&
       (*(int *)((long)psVar2 + lVar10 + -5) == 0)) {
      cVar1 = *(char *)((long)psVar2 + lVar10 + -1);
      if (cVar1 == '\x02') {
        uVar5 = uVar9;
      }
      uVar5 = uVar5 & 0xffffffff;
      if ((cVar1 - 8U & 0xf7) == 0) {
        uVar3 = uVar9 & 0xffffffff;
      }
      if (cVar1 == ' ') {
        uVar8 = uVar9 & 0xffffffff;
      }
      if (cVar1 == '\x04') {
        uVar8 = uVar9 & 0xffffffff;
      }
    }
    lVar10 = lVar10 + 0xc;
  }
  if ((int)uVar5 < 0) {
    pInfo->estimatedCost = 1000000.0;
    if ((int)uVar8 < 0) {
      uVar6 = 1;
      uVar4 = 0;
      dVar11 = 500000.0;
    }
    else {
      pInfo->aConstraintUsage[uVar8].argvIndex = 1;
      pInfo->estimatedCost = 500000.0;
      dVar11 = 250000.0;
      uVar6 = 2;
      uVar4 = uVar6;
    }
    if (-1 < (int)uVar3) {
      uVar4 = uVar4 | 4;
      pInfo->aConstraintUsage[uVar3].argvIndex = uVar6;
      pInfo->estimatedCost = dVar11;
    }
  }
  else {
    pInfo->aConstraintUsage[uVar5 & 0xffffffff].argvIndex = 1;
    pInfo->estimatedCost = 100.0;
    uVar4 = 1;
  }
  if (((pInfo->nOrderBy == 1) && (pInfo->aOrderBy->iColumn == 0)) && (pInfo->aOrderBy->desc == '\0')
     ) {
    pInfo->orderByConsumed = 1;
  }
  pInfo->idxNum = uVar4;
  return 0;
}

Assistant:

static int fts5VocabBestIndexMethod(
  sqlite3_vtab *pUnused,
  sqlite3_index_info *pInfo
){
  int i;
  int iTermEq = -1;
  int iTermGe = -1;
  int iTermLe = -1;
  int idxNum = 0;
  int nArg = 0;

  UNUSED_PARAM(pUnused);

  for(i=0; i<pInfo->nConstraint; i++){
    struct sqlite3_index_constraint *p = &pInfo->aConstraint[i];
    if( p->usable==0 ) continue;
    if( p->iColumn==0 ){          /* term column */
      if( p->op==SQLITE_INDEX_CONSTRAINT_EQ ) iTermEq = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_LE ) iTermLe = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_LT ) iTermLe = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_GE ) iTermGe = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_GT ) iTermGe = i;
    }
  }

  if( iTermEq>=0 ){
    idxNum |= FTS5_VOCAB_TERM_EQ;
    pInfo->aConstraintUsage[iTermEq].argvIndex = ++nArg;
    pInfo->estimatedCost = 100;
  }else{
    pInfo->estimatedCost = 1000000;
    if( iTermGe>=0 ){
      idxNum |= FTS5_VOCAB_TERM_GE;
      pInfo->aConstraintUsage[iTermGe].argvIndex = ++nArg;
      pInfo->estimatedCost = pInfo->estimatedCost / 2;
    }
    if( iTermLe>=0 ){
      idxNum |= FTS5_VOCAB_TERM_LE;
      pInfo->aConstraintUsage[iTermLe].argvIndex = ++nArg;
      pInfo->estimatedCost = pInfo->estimatedCost / 2;
    }
  }

  /* This virtual table always delivers results in ascending order of
  ** the "term" column (column 0). So if the user has requested this
  ** specifically - "ORDER BY term" or "ORDER BY term ASC" - set the
  ** sqlite3_index_info.orderByConsumed flag to tell the core the results
  ** are already in sorted order.  */
  if( pInfo->nOrderBy==1 
   && pInfo->aOrderBy[0].iColumn==0 
   && pInfo->aOrderBy[0].desc==0
  ){
    pInfo->orderByConsumed = 1;
  }

  pInfo->idxNum = idxNum;
  return SQLITE_OK;
}